

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdata.c
# Opt level: O3

_Bool duckdb_je_hpdata_purge_next
                (hpdata_t *hpdata,hpdata_purge_state_t *purge_state,void **r_purge_addr,
                size_t *r_purge_size)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  size_t sVar4;
  fb_group_t fVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar7 = purge_state->next_purge_search_begin;
  if (uVar7 != 0x200) {
    uVar3 = uVar7 >> 6;
    fVar5 = (purge_state->to_purge[uVar3] >> ((byte)uVar7 & 0x3f)) << ((byte)uVar7 & 0x3f);
    while (fVar5 == 0) {
      if (uVar3 == 7) {
        return false;
      }
      lVar2 = uVar3 + 1;
      uVar3 = uVar3 + 1;
      fVar5 = purge_state->to_purge[lVar2];
    }
    uVar7 = 0;
    if (fVar5 != 0) {
      for (; (fVar5 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
      }
    }
    uVar6 = uVar3 << 6 | uVar7;
    if (uVar6 != 0x200) {
      uVar3 = uVar3 & 0x3ffffffffffffff;
      uVar7 = (~purge_state->to_purge[uVar3] >> ((byte)uVar7 & 0x3f)) << ((byte)uVar7 & 0x3f);
      if (uVar7 == 0) {
        do {
          if (uVar3 == 7) {
            sVar4 = 0x200;
            goto LAB_01179cc5;
          }
          lVar2 = uVar3 + 1;
          uVar3 = uVar3 + 1;
        } while (purge_state->to_purge[lVar2] == 0xffffffffffffffff);
        uVar7 = ~purge_state->to_purge[lVar2];
      }
      uVar1 = 0;
      if (uVar7 != 0) {
        for (; (uVar7 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
        }
      }
      sVar4 = uVar3 << 6 | uVar1;
      if (0x1ff < sVar4) {
        sVar4 = 0x200;
      }
LAB_01179cc5:
      *r_purge_addr = (void *)(uVar6 * 0x1000 + (long)hpdata->h_address);
      *r_purge_size = (sVar4 - uVar6) * 0x1000;
      purge_state->next_purge_search_begin = sVar4;
      purge_state->npurged = purge_state->npurged + (sVar4 - uVar6);
      return true;
    }
  }
  return false;
}

Assistant:

bool
hpdata_purge_next(hpdata_t *hpdata, hpdata_purge_state_t *purge_state,
    void **r_purge_addr, size_t *r_purge_size) {
	/*
	 * Note that we don't have a consistency check here; we're accessing
	 * hpdata without synchronization, and therefore have no right to expect
	 * a consistent state.
	 */
	assert(!hpdata_alloc_allowed_get(hpdata));

	if (purge_state->next_purge_search_begin == HUGEPAGE_PAGES) {
		return false;
	}
	size_t purge_begin;
	size_t purge_len;
	bool found_range = fb_srange_iter(purge_state->to_purge, HUGEPAGE_PAGES,
	    purge_state->next_purge_search_begin, &purge_begin, &purge_len);
	if (!found_range) {
		return false;
	}

	*r_purge_addr = (void *)(
	    (byte_t *)hpdata_addr_get(hpdata) + purge_begin * PAGE);
	*r_purge_size = purge_len * PAGE;

	purge_state->next_purge_search_begin = purge_begin + purge_len;
	purge_state->npurged += purge_len;
	assert(purge_state->npurged <= HUGEPAGE_PAGES);

	return true;
}